

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O0

void __thiscall QAccessibleSpinBox::QAccessibleSpinBox(QAccessibleSpinBox *this,QWidget *w)

{
  long lVar1;
  QLatin1StringView latin1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QWidget *in_stack_ffffffffffffffb8;
  QAccessibleAbstractSpinBox *in_stack_ffffffffffffffc0;
  QString *signal;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  signal = in_RDI;
  QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (in_RDI->d).d = (Data *)&PTR__QAccessibleSpinBox_00d2a1f0;
  (in_RDI->d).size = (qsizetype)&PTR__QAccessibleSpinBox_00d2a380;
  in_RDI[1].d.ptr = (char16_t *)&PTR__QAccessibleSpinBox_00d2a3c8;
  in_RDI[1].d.size = (qsizetype)&PTR__QAccessibleSpinBox_00d2a410;
  in_RDI[2].d.d = (Data *)&PTR__QAccessibleSpinBox_00d2a4b0;
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_ffffffffffffffb8,(size_t)in_RDI);
  latin1.m_data = in_stack_ffffffffffffffe8;
  latin1.m_size = (qsizetype)in_stack_ffffffffffffffe0;
  QString::QString((QString *)QVar2.m_size,latin1);
  QAccessibleWidget::addControllingSignal(in_stack_ffffffffffffffe0,signal);
  QString::~QString((QString *)0x7eca7c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleSpinBox::QAccessibleSpinBox(QWidget *w)
: QAccessibleAbstractSpinBox(w)
{
    Q_ASSERT(spinBox());
    addControllingSignal("valueChanged(int)"_L1);
}